

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRepresentationContext::~IfcRepresentationContext
          (IfcRepresentationContext *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcRepresentationContext_00965a60;
  *(undefined ***)&this->field_0x60 = &PTR__IfcRepresentationContext_00965a88;
  pcVar1 = (this->ContextType).ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ContextType).ptr.field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
             field_0x10;
  if (puVar2 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>).
                 field_0x20) {
    operator_delete(puVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcRepresentationContext() : Object("IfcRepresentationContext") {}